

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O3

void __thiscall trun::TestRunner::DumpTestsToRun(TestRunner *this)

{
  element_type *peVar1;
  TestFunc *pTVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 *puVar4;
  bool bVar5;
  Config *pCVar6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  uint uVar9;
  undefined8 uVar10;
  uint uVar11;
  undefined8 *puVar12;
  
  if ((this->globalExit).super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0 ||
      (this->globalMain).super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    pCVar6 = Config::Instance();
    printf("%c Globals:\n",(ulong)((pCVar6->testGlobalMain ^ 1) * 3 + 0x2a));
    peVar1 = (this->globalMain).super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar1 != (element_type *)0x0) {
      printf("    ::%s (%s)\n",(peVar1->caseName)._M_dataplus._M_p,
             (peVar1->symbolName)._M_dataplus._M_p);
    }
    peVar1 = (this->globalExit).super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar1 != (element_type *)0x0) {
      printf("    ::%s (%s)\n",(peVar1->caseName)._M_dataplus._M_p,
             (peVar1->symbolName)._M_dataplus._M_p);
    }
  }
  p_Var7 = (this->testModules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(this->testModules)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 == p_Var8) {
    uVar9 = 0;
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    uVar9 = 0;
    do {
      bVar5 = TestModule::ShouldExecute(*(TestModule **)(p_Var7 + 2));
      printf("%c Module: %s\n",(ulong)((uint)!bVar5 + (uint)!bVar5 * 2 + 0x2a),
             *(undefined8 *)(p_Var7 + 1));
      pTVar2 = *(TestFunc **)(*(long *)(p_Var7 + 2) + 0x80);
      if (pTVar2 != (TestFunc *)0x0) {
        p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)(p_Var7 + 2) + 0x88);
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        bVar5 = TestFunc::ShouldExecuteNoDeps(pTVar2);
        uVar10 = 0x20;
        if (bVar5) {
          bVar5 = TestModule::ShouldExecute(*(TestModule **)(p_Var7 + 2));
          uVar10 = 0x20;
          if (bVar5) {
            uVar10 = 0x2a;
          }
        }
        printf("  %cm %s (%s)\n",uVar10,(pTVar2->caseName)._M_dataplus._M_p,
               (pTVar2->symbolName)._M_dataplus._M_p);
        uVar9 = uVar9 + 1;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
      }
      pTVar2 = *(TestFunc **)(*(long *)(p_Var7 + 2) + 0x90);
      if (pTVar2 != (TestFunc *)0x0) {
        p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)(p_Var7 + 2) + 0x98);
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        bVar5 = TestFunc::ShouldExecuteNoDeps(pTVar2);
        uVar10 = 0x20;
        if (bVar5) {
          bVar5 = TestModule::ShouldExecute(*(TestModule **)(p_Var7 + 2));
          uVar10 = 0x20;
          if (bVar5) {
            uVar10 = 0x2a;
          }
        }
        printf("  %ce %s (%s)\n",uVar10,(pTVar2->caseName)._M_dataplus._M_p,
               (pTVar2->symbolName)._M_dataplus._M_p);
        uVar9 = uVar9 + 1;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
      }
      puVar4 = *(undefined8 **)(*(long *)(p_Var7 + 2) + 0x170);
      for (puVar12 = *(undefined8 **)(*(long *)(p_Var7 + 2) + 0x168); puVar12 != puVar4;
          puVar12 = puVar12 + 2) {
        pTVar2 = (TestFunc *)*puVar12;
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar12[1];
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        bVar5 = TestFunc::ShouldExecuteNoDeps(pTVar2);
        uVar10 = 0x20;
        if (bVar5) {
          bVar5 = TestModule::ShouldExecute(*(TestModule **)(p_Var7 + 2));
          uVar10 = 0x20;
          if (bVar5) {
            uVar10 = 0x2a;
          }
        }
        printf("  %c  %s::%s (%s)\n",uVar10,*(undefined8 *)(p_Var7 + 1),
               (pTVar2->caseName)._M_dataplus._M_p,(pTVar2->symbolName)._M_dataplus._M_p);
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        uVar9 = uVar9 + 1;
      }
      uVar11 = uVar11 + 1;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var8);
  }
  printf("=== Modules: %d\n",(ulong)uVar11);
  printf("=== Cases..: %d\n",(ulong)uVar9);
  return;
}

Assistant:

void TestRunner::DumpTestsToRun() {
    int nModules = 0;
    int nTestCases = 0;

    // Dump 'test_main' / 'test_exit' (i.e. global main/exit)
    if ((globalMain != nullptr) || (globalExit != nullptr)){
        printf("%c Globals:\n", Config::Instance().testGlobalMain?'*':'-');
        if (globalMain != nullptr) {
            printf("    ::%s (%s)\n", globalMain->CaseName().c_str(), globalMain->SymbolName().c_str());
        }
        if (globalExit != nullptr) {
            printf("    ::%s (%s)\n", globalExit->CaseName().c_str(), globalExit->SymbolName().c_str());
        }
    }

    // Dump info for each module...
    for(auto &[moduleName, module] : testModules) {
        bool bExec = module->ShouldExecute();
        printf("%c Module: %s\n",bExec?'*':'-',moduleName.c_str());
        if (module->mainFunc != nullptr) {
            auto t = module->mainFunc;
            bool bExecTest = t->ShouldExecuteNoDeps() && module->ShouldExecute();
            printf("  %cm %s (%s)\n", bExecTest?'*':' ',t->CaseName().c_str(), t->SymbolName().c_str());
            nTestCases++;
        }
        if (module->exitFunc != nullptr) {
            auto t = module->exitFunc;
            bool bExecTest = t->ShouldExecuteNoDeps() && module->ShouldExecute();
            printf("  %ce %s (%s)\n",bExecTest?'*':' ', t->CaseName().c_str(), t->SymbolName().c_str());
            nTestCases++;
        }
        for(auto t : module->testFuncs) {
            bool bExecTest = t->ShouldExecuteNoDeps() && module->ShouldExecute();
            printf("  %c  %s::%s (%s)\n", bExecTest?'*':' ',moduleName.c_str(), t->CaseName().c_str(), t->SymbolName().c_str());
            nTestCases++;
        }
        nModules++;
    }
    printf("=== Modules: %d\n", nModules);
    printf("=== Cases..: %d\n", nTestCases);
}